

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::AtomicCounterBufferIndexVerifier::validateSingleVariable
          (AtomicCounterBufferIndexVerifier *this,
          vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
          *path,string *resource,GLint propValue,string *implementationName)

{
  bool bVar1;
  DataType dataType;
  int iVar2;
  deUint32 err;
  const_reference this_00;
  VarType *this_01;
  TestLog *pTVar3;
  MessageBuilder *pMVar4;
  undefined4 extraout_var;
  allocator<char> local_841;
  string local_840;
  MessageBuilder local_820;
  int local_69c;
  long lStack_698;
  GLint numActiveResources;
  Functions *gl;
  string local_688;
  MessageBuilder local_668;
  MessageBuilder local_4e8;
  allocator<char> local_361;
  string local_360;
  MessageBuilder local_340;
  MessageBuilder local_1b0;
  string *local_30;
  string *implementationName_local;
  string *psStack_20;
  GLint propValue_local;
  string *resource_local;
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
  *path_local;
  AtomicCounterBufferIndexVerifier *this_local;
  
  local_30 = implementationName;
  implementationName_local._4_4_ = propValue;
  psStack_20 = resource;
  resource_local = (string *)path;
  path_local = (vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                *)this;
  this_00 = std::
            vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
            ::back(path);
  this_01 = ProgramInterfaceDefinition::VariablePathComponent::getVariableType(this_00);
  dataType = glu::VarType::getBasicType(this_01);
  bVar1 = glu::isDataTypeAtomicCounter(dataType);
  if (bVar1) {
    pTVar3 = tcu::TestContext::getLog
                       ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx);
    tcu::TestLog::operator<<(&local_4e8,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_4e8,
                        (char (*) [63])
                        "Verifying atomic counter buffer index, expecting a valid index");
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4e8);
    if (implementationName_local._4_4_ == -1) {
      pTVar3 = tcu::TestContext::getLog
                         ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx);
      tcu::TestLog::operator<<(&local_668,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<(&local_668,(char (*) [13])"\tError, got ");
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(int *)((long)&implementationName_local + 4));
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_668);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_688,"resource atomic counter buffer index invalid",
                 (allocator<char> *)((long)&gl + 7));
      PropValidator::setError((PropValidator *)this,&local_688);
      std::__cxx11::string::~string((string *)&local_688);
      std::allocator<char>::~allocator((allocator<char> *)((long)&gl + 7));
    }
    else {
      iVar2 = (*((this->super_SingleVariableValidator).super_PropValidator.m_renderContext)->
                _vptr_RenderContext[3])();
      lStack_698 = CONCAT44(extraout_var,iVar2);
      local_69c = 0;
      (**(code **)(lStack_698 + 0x990))
                ((this->super_SingleVariableValidator).m_programID,0x92c0,0x92f5,&local_69c);
      err = (**(code **)(lStack_698 + 0x800))();
      glu::checkError(err,
                      "getProgramInterfaceiv(..., GL_ATOMIC_COUNTER_BUFFER, GL_ACTIVE_RESOURCES, ...)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTestCase.cpp"
                      ,0x302);
      if (local_69c <= implementationName_local._4_4_) {
        pTVar3 = tcu::TestContext::getLog
                           ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx);
        tcu::TestLog::operator<<(&local_820,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar4 = tcu::MessageBuilder::operator<<(&local_820,(char (*) [13])"\tError, got ");
        pMVar4 = tcu::MessageBuilder::operator<<
                           (pMVar4,(int *)((long)&implementationName_local + 4));
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [25])", GL_ACTIVE_RESOURCES = ");
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_69c);
        tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_820);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_840,"resource atomic counter buffer index invalid",&local_841);
        PropValidator::setError((PropValidator *)this,&local_840);
        std::__cxx11::string::~string((string *)&local_840);
        std::allocator<char>::~allocator(&local_841);
      }
    }
  }
  else {
    pTVar3 = tcu::TestContext::getLog
                       ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx);
    tcu::TestLog::operator<<(&local_1b0,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_1b0,
                        (char (*) [52])"Verifying atomic counter buffer index, expecting -1");
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b0);
    if (implementationName_local._4_4_ != -1) {
      pTVar3 = tcu::TestContext::getLog
                         ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx);
      tcu::TestLog::operator<<(&local_340,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<(&local_340,(char (*) [13])"\tError, got ");
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(int *)((long)&implementationName_local + 4));
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_340);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_360,"resource atomic counter buffer index invalid",&local_361);
      PropValidator::setError((PropValidator *)this,&local_360);
      std::__cxx11::string::~string((string *)&local_360);
      std::allocator<char>::~allocator(&local_361);
    }
  }
  return;
}

Assistant:

void AtomicCounterBufferIndexVerifier::validateSingleVariable (const std::vector<VariablePathComponent>& path, const std::string& resource, glw::GLint propValue, const std::string& implementationName) const
{
	DE_UNREF(resource);
	DE_UNREF(implementationName);

	if (!glu::isDataTypeAtomicCounter(path.back().getVariableType()->getBasicType()))
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying atomic counter buffer index, expecting -1" << tcu::TestLog::EndMessage;

		if (propValue != -1)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "\tError, got " << propValue << tcu::TestLog::EndMessage;
			setError("resource atomic counter buffer index invalid");
		}
	}
	else
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying atomic counter buffer index, expecting a valid index" << tcu::TestLog::EndMessage;

		if (propValue == -1)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "\tError, got " << propValue << tcu::TestLog::EndMessage;
			setError("resource atomic counter buffer index invalid");
		}
		else
		{
			const glw::Functions&	gl					= m_renderContext.getFunctions();
			glw::GLint				numActiveResources	= 0;

			gl.getProgramInterfaceiv(m_programID, GL_ATOMIC_COUNTER_BUFFER, GL_ACTIVE_RESOURCES, &numActiveResources);
			GLU_EXPECT_NO_ERROR(gl.getError(), "getProgramInterfaceiv(..., GL_ATOMIC_COUNTER_BUFFER, GL_ACTIVE_RESOURCES, ...)");

			if (propValue >= numActiveResources)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "\tError, got " << propValue << ", GL_ACTIVE_RESOURCES = " << numActiveResources << tcu::TestLog::EndMessage;
				setError("resource atomic counter buffer index invalid");
			}
		}
	}
}